

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O0

PSH_Globals_Funcs cff_size_get_globals_funcs(CFF_Size size)

{
  FT_Driver_Class pFVar1;
  FT_Module pFVar2;
  PSH_Globals_Funcs local_38;
  FT_Module module;
  PSHinter_Service pshinter;
  CFF_Font_conflict font;
  CFF_Face face;
  CFF_Size size_local;
  
  pFVar1 = (size->root).face[4].driver[0x58].clazz;
  pFVar2 = FT_Get_Module((((size->root).face)->driver->root).library,"pshinter");
  if (((pFVar2 == (FT_Module)0x0) || (pFVar1 == (FT_Driver_Class)0x0)) ||
     ((pFVar1->root).module_flags == 0)) {
    local_38 = (PSH_Globals_Funcs)0x0;
  }
  else {
    local_38 = (PSH_Globals_Funcs)(*(code *)(pFVar1->root).module_flags)(pFVar2);
  }
  return local_38;
}

Assistant:

static PSH_Globals_Funcs
  cff_size_get_globals_funcs( CFF_Size  size )
  {
    CFF_Face          face     = (CFF_Face)size->root.face;
    CFF_Font          font     = (CFF_Font)face->extra.data;
    PSHinter_Service  pshinter = font->pshinter;
    FT_Module         module;


    module = FT_Get_Module( size->root.face->driver->root.library,
                            "pshinter" );
    return ( module && pshinter && pshinter->get_globals_funcs )
           ? pshinter->get_globals_funcs( module )
           : 0;
  }